

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O1

void __thiscall
MipsOpcodeFormatter::handleOpcodeName(MipsOpcodeFormatter *this,MipsOpcodeData *opData)

{
  char cVar1;
  char *pcVar2;
  
  pcVar2 = (opData->opcode).name;
  cVar1 = *pcVar2;
  while (cVar1 != '\0') {
    pcVar2 = pcVar2 + 1;
    if (cVar1 != 'B') {
      std::__cxx11::string::push_back((char)this);
    }
    cVar1 = *pcVar2;
  }
  return;
}

Assistant:

void MipsOpcodeFormatter::handleOpcodeName(const MipsOpcodeData& opData)
{
	const char* encoding = opData.opcode.name;

	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case 'S':
			buffer += "sptq"[opData.vfpuSize];
			break;
		case 'B':
			// TODO
			break;
		default:
			buffer += *(encoding-1);
			break;
		}
	}
}